

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::copyNextWord(ObjFileParser *this,char *pBuffer,size_t length)

{
  bool bVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  reference pcVar3;
  byte local_61;
  ulong local_28;
  size_t index;
  size_t length_local;
  char *pBuffer_local;
  ObjFileParser *this_local;
  
  local_28 = 0;
  _Var2 = getNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var2._M_current;
  pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*(&this->m_DataIt);
  if (*pcVar3 == '\\') {
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&this->m_DataIt);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&this->m_DataIt);
    _Var2 = getNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
    (this->m_DataIt)._M_current = _Var2._M_current;
  }
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&this->m_DataIt,&this->m_DataItEnd);
    local_61 = 0;
    if (bVar1) {
      pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt);
      bVar1 = IsSpaceOrNewLine<char>(*pcVar3);
      local_61 = bVar1 ^ 0xff;
    }
    if ((local_61 & 1) == 0) break;
    pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    pBuffer[local_28] = *pcVar3;
    local_28 = local_28 + 1;
    if (local_28 == length - 1) break;
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&this->m_DataIt);
  }
  if (length <= local_28) {
    __assert_fail("index < length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileParser.cpp"
                  ,0x104,"void Assimp::ObjFileParser::copyNextWord(char *, size_t)");
  }
  pBuffer[local_28] = '\0';
  return;
}

Assistant:

void ObjFileParser::copyNextWord(char *pBuffer, size_t length) {
    size_t index = 0;
    m_DataIt = getNextWord<DataArrayIt>(m_DataIt, m_DataItEnd);
    if ( *m_DataIt == '\\' ) {
        ++m_DataIt;
        ++m_DataIt;
        m_DataIt = getNextWord<DataArrayIt>( m_DataIt, m_DataItEnd );
    }
    while( m_DataIt != m_DataItEnd && !IsSpaceOrNewLine( *m_DataIt ) ) {
        pBuffer[index] = *m_DataIt;
        index++;
        if( index == length - 1 ) {
            break;
        }
        ++m_DataIt;
    }

    ai_assert(index < length);
    pBuffer[index] = '\0';
}